

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void lyxp_set_free(lyxp_set *set)

{
  lyxp_set *set_local;
  
  if (set != (lyxp_set *)0x0) {
    if (set->type == LYXP_SET_NODE_SET) {
      free((set->val).nodes);
    }
    else if (set->type == LYXP_SET_SNODE_SET) {
      free((set->val).nodes);
    }
    else if (set->type == LYXP_SET_STRING) {
      free((set->val).nodes);
    }
    free(set);
  }
  return;
}

Assistant:

void
lyxp_set_free(struct lyxp_set *set)
{
    if (!set) {
        return;
    }

    if (set->type == LYXP_SET_NODE_SET) {
        free(set->val.nodes);
    } else if (set->type == LYXP_SET_SNODE_SET) {
        free(set->val.snodes);
    } else if (set->type == LYXP_SET_STRING) {
        free(set->val.str);
    }
    free(set);
}